

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

void __thiscall
llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::
OptionalStorage(OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *this,
               OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *O)

{
  function<void_(llbuild::basic::ProcessResult)> *__x;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *O_local;
  OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *this_local;
  
  this->hasVal = (bool)(O->hasVal & 1);
  if ((this->hasVal & 1U) != 0) {
    __x = getPointer(O);
    std::function<void_(llbuild::basic::ProcessResult)>::function
              ((function<void_(llbuild::basic::ProcessResult)> *)this,__x);
  }
  return;
}

Assistant:

OptionalStorage(const OptionalStorage &O) : hasVal(O.hasVal) {
    if (hasVal)
      new (storage.buffer) T(*O.getPointer());
  }